

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O0

void libdef_rec(BuildCtx *ctx,char *p,int arg)

{
  uint32_t uVar1;
  char *pcVar2;
  char *pcStack_28;
  uint32_t n;
  char *q;
  char *pcStack_18;
  int arg_local;
  char *p_local;
  BuildCtx *ctx_local;
  
  if (ctx->mode == BUILD_recdef) {
    for (; recffid + 1 < ffid; recffid = recffid + 1) {
      fprintf((FILE *)ctx->fp,",\n0");
    }
    recffid = ffid;
    pcStack_18 = p;
    if (*p == '.') {
      pcStack_18 = funcname;
    }
    pcVar2 = strchr(pcStack_18,0x20);
    pcStack_28 = pcVar2;
    if (pcVar2 != (char *)0x0) {
      pcStack_28 = pcVar2 + 1;
      *pcVar2 = '\0';
    }
    uVar1 = find_rec(pcStack_18);
    if (pcStack_28 == (char *)0x0) {
      fprintf((FILE *)ctx->fp,",\n0x%02x00",(ulong)uVar1);
    }
    else {
      fprintf((FILE *)ctx->fp,",\n0x%02x00+(%s)",(ulong)uVar1,pcStack_28);
    }
  }
  return;
}

Assistant:

static void libdef_rec(BuildCtx *ctx, char *p, int arg)
{
  UNUSED(arg);
  if (ctx->mode == BUILD_recdef) {
    char *q;
    uint32_t n;
    for (; recffid+1 < ffid; recffid++)
      fprintf(ctx->fp, ",\n0");
    recffid = ffid;
    if (*p == '.') p = funcname;
    q = strchr(p, ' ');
    if (q) *q++ = '\0';
    n = find_rec(p);
    if (q)
      fprintf(ctx->fp, ",\n0x%02x00+(%s)", n, q);
    else
      fprintf(ctx->fp, ",\n0x%02x00", n);
  }
}